

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::set_external_address
          (session_impl *this,endpoint *param_1,address *ip,ip_source_t source_type,address *source)

{
  pointer psVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  __it;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  sock;
  long lVar3;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:7080:6)>
  local_50;
  undefined4 local_44;
  address *local_40;
  address *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000009,source_type.m_val);
  __it._M_current =
       (this->m_listen_sockets).
       super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)psVar1 - (long)__it._M_current >> 6;
  local_50._M_pred.local_endpoint =
       (anon_class_8_1_c3cffa27_for__M_pred)(anon_class_8_1_c3cffa27_for__M_pred)param_1;
  local_40 = ip;
  local_38 = source;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
              ::operator()(&local_50,__it);
      sock._M_current = __it._M_current;
      if (bVar2) goto LAB_002d7e8b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
              ::operator()(&local_50,__it._M_current + 1);
      sock._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_002d7e8b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
              ::operator()(&local_50,__it._M_current + 2);
      sock._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_002d7e8b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
              ::operator()(&local_50,__it._M_current + 3);
      sock._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_002d7e8b;
      __it._M_current = __it._M_current + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)psVar1 - (long)__it._M_current >> 4;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      sock._M_current = psVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
                  ::operator()(&local_50,__it), sock._M_current = __it._M_current, bVar2))
      goto LAB_002d7e8b;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
            ::operator()(&local_50,__it);
    sock._M_current = __it._M_current;
    if (bVar2) goto LAB_002d7e8b;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::$_0>
          ::operator()(&local_50,__it);
  sock._M_current = psVar1;
  if (bVar2) {
    sock._M_current = __it._M_current;
  }
LAB_002d7e8b:
  if (sock._M_current ==
      (this->m_listen_sockets).
      super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  set_external_address(this,sock._M_current,local_40,local_44._0_1_,local_38);
  return;
}

Assistant:

void session_impl::set_external_address(
		tcp::endpoint const& local_endpoint, address const& ip
		, ip_source_t const source_type, address const& source)
	{
		auto sock = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&](std::shared_ptr<listen_socket_t> const& v)
			{ return v->local_endpoint.address() == local_endpoint.address(); });

		if (sock != m_listen_sockets.end())
			set_external_address(*sock, ip, source_type, source);
	}